

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Dsp.cpp
# Opt level: O2

void __thiscall Spc_Dsp::mute_voices(Spc_Dsp *this,int mask)

{
  int *piVar1;
  long lVar2;
  int addr;
  
  (this->m).mute_mask = mask;
  piVar1 = &(this->m).voices[0].enabled;
  addr = 0;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    *piVar1 = (((uint)mask >> ((uint)lVar2 & 0x1f) & 1) != 0) - 1;
    update_voice_vol(this,addr);
    addr = addr + 0x10;
    piVar1 = piVar1 + 0x24;
  }
  return;
}

Assistant:

void Spc_Dsp::mute_voices( int mask )
{
	m.mute_mask = mask;
	for ( int i = 0; i < voice_count; i++ )
	{
		m.voices [i].enabled = (mask >> i & 1) - 1;
		update_voice_vol( i * 0x10 );
	}
}